

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::ParseContext::ReadSizeAndPushLimitAndDepth
          (ParseContext *this,char *ptr,LimitToken *old_limit)

{
  LimitToken *old_limit_local;
  char *ptr_local;
  ParseContext *this_local;
  undefined1 local_30 [12];
  int size;
  ZeroCopyInputStream *local_20;
  ParseContext *local_18;
  ZeroCopyInputStream *local_10;
  
  unique0x10000093 = old_limit;
  local_20 = (ZeroCopyInputStream *)ptr;
  local_18 = this;
  local_30._4_4_ = ReadSize((char **)&local_20);
  if ((local_20 == (ZeroCopyInputStream *)0x0) || (this->depth_ < 1)) {
    local_10 = (ZeroCopyInputStream *)0x0;
  }
  else {
    EpsCopyInputStream::PushLimit((EpsCopyInputStream *)local_30,(char *)this,(int)local_20);
    EpsCopyInputStream::LimitToken::operator=(stack0xffffffffffffffd8,(LimitToken *)local_30);
    EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)local_30);
    this->depth_ = this->depth_ + -1;
    local_10 = local_20;
  }
  return (char *)local_10;
}

Assistant:

const char* ParseContext::ReadSizeAndPushLimitAndDepth(const char* ptr,
                                                       LimitToken* old_limit) {
  return ReadSizeAndPushLimitAndDepthInlined(ptr, old_limit);
}